

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.cpp
# Opt level: O1

void __thiscall OpenMD::RNEMD::SPFForceManager::combineForcesAndTorques(SPFForceManager *this)

{
  Molecule *pMVar1;
  StuntDouble *this_00;
  pointer ppSVar2;
  double dVar3;
  MoleculeIterator mi;
  MoleculeIterator local_50;
  double local_48;
  undefined8 uStack_40;
  RealType local_38;
  long local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  local_50._M_node = (_Base_ptr)0x0;
  Snapshot::getSPFData(this->currentSnapshot_);
  local_48 = pow(*(double *)(local_30 + 0x18),(double)this->k_);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  pMVar1 = SimInfo::beginMolecule((this->super_ForceManager).info_,&local_50);
  if (pMVar1 != (Molecule *)0x0) {
    dVar3 = 1.0;
    if (local_48 <= 1.0) {
      dVar3 = local_48;
    }
    local_48 = (double)(~-(ulong)(local_48 < 0.0) & (ulong)dVar3);
    uStack_40 = 0;
    local_38 = 1.0 - local_48;
    do {
      ppSVar2 = (pMVar1->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppSVar2 ==
          (pMVar1->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_00 = (StuntDouble *)0x0;
      }
      else {
        this_00 = *ppSVar2;
      }
      while (this_00 != (StuntDouble *)0x0) {
        ppSVar2 = ppSVar2 + 1;
        StuntDouble::combineForcesAndTorques
                  (this_00,this->temporarySourceSnapshot_,this->temporarySinkSnapshot_,local_38,
                   local_48);
        if (ppSVar2 ==
            (pMVar1->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          this_00 = (StuntDouble *)0x0;
        }
        else {
          this_00 = *ppSVar2;
        }
      }
      pMVar1 = SimInfo::nextMolecule((this->super_ForceManager).info_,&local_50);
    } while (pMVar1 != (Molecule *)0x0);
  }
  return;
}

Assistant:

void SPFForceManager::combineForcesAndTorques() {
    // Calculate lambda-averaged forces on all atoms and potentials:
    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::IntegrableObjectIterator ii;
    StuntDouble* sd;

    RealType result = f_lambda(currentSnapshot_->getSPFData()->lambda);

    // Now scale forces and torques of all the sds
    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        sd->combineForcesAndTorques(temporarySourceSnapshot_,
                                    temporarySinkSnapshot_, 1.0 - result,
                                    result);
      }
    }
  }